

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O2

void __thiscall
luna::CodeGenerateVisitor::SetTableFieldValue<luna::TableIndexField>
          (CodeGenerateVisitor *this,TableIndexField *field,int table_register,int key_register,
          int line)

{
  SyntaxTree *pSVar1;
  uint uVar2;
  ExpVarData_conflict exp_var_data;
  
  uVar2 = GenerateRegisterId(this);
  pSVar1 = (field->value_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,this);
  Function::AddInstruction
            (this->current_function_->function_,
             (Instruction)
             ((uVar2 & 0xff) + ((key_register & 0xffU) << 8 | (table_register & 0xffU) << 0x10) +
             0x24000000),line);
  return;
}

Assistant:

void CodeGenerateVisitor::SetTableFieldValue(TableFieldType *field,
                                                 int table_register,
                                                 int key_register,
                                                 int line)
    {
        // Load value
        auto value_register = GenerateRegisterId();
        ExpVarData exp_var_data{ value_register, value_register + 1 };
        field->value_->Accept(this, &exp_var_data);

        // Set table field
        auto instruction = Instruction::ABCCode(OpType_SetTable, table_register,
                                                key_register, value_register);
        GetCurrentFunction()->AddInstruction(instruction, line);
    }